

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint32_t farmhash32_mk_with_seed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  if (0x18 < len) {
    uVar1 = farmhash32_mk_len_13_to_24(s,0x18,(uint)len ^ seed);
    uVar2 = farmhash32_mk(s + 0x18,len - 0x18);
    uVar1 = mur(seed + uVar2,uVar1);
    return uVar1;
  }
  if (0xc < len) {
    uVar1 = farmhash32_mk_len_13_to_24(s,len,seed * -0x3361d2af);
    return uVar1;
  }
  if (4 < len) {
    uVar1 = farmhash32_mk_len_5_to_12(s,len,seed);
    return uVar1;
  }
  uVar1 = farmhash32_mk_len_0_to_4(s,len,seed);
  return uVar1;
}

Assistant:

uint32_t farmhash32_mk_with_seed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhash32_mk_len_13_to_24(s, len, seed * c1);
    else if (len >= 5) return farmhash32_mk_len_5_to_12(s, len, seed);
    else return farmhash32_mk_len_0_to_4(s, len, seed);
  }
  uint32_t h = farmhash32_mk_len_13_to_24(s, 24, seed ^ len);
  return mur(farmhash32_mk(s + 24, len - 24) + seed, h);
}